

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O2

void test_read_at_least_chunks(void)

{
  cio_buffered_stream *buffered_stream;
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  size_t second_chunk;
  size_t first_chunk;
  uint8_t buffer [40];
  cio_read_buffer rb;
  
  ms = (memory_stream *)malloc(0x100);
  iVar1 = memory_stream_init(ms,"HelloWorld!");
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x2e2,UNITY_DISPLAY_STYLE_INT);
  read_some_fake.custom_fake = read_some_chunks;
  dummy_read_handler_fake.custom_fake = save_to_check_buffer;
  rb.data = buffer;
  rb.end = (uint8_t *)&rb;
  rb.add_ptr = rb.data;
  rb.fetch_ptr = rb.data;
  UnityAssertEqualNumber
            (0,0,"Read buffer was not initialized correctly!",0x2e9,UNITY_DISPLAY_STYLE_INT);
  first_chunk = 2;
  buffered_stream = (cio_buffered_stream *)(ms + 1);
  cVar2 = cio_buffered_stream_init(buffered_stream,(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x2ed,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_read_at_least(buffered_stream,&rb,2,dummy_read_handler,&first_chunk);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x2ef,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x2f0,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_read_handler_fake.arg2_history[0],
             "Handler was not called with CIO_SUCCESS!",0x2f1,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&rb,(UNITY_INT)dummy_read_handler_fake.arg3_history[0],
             "Handler was not called with original read buffer!",0x2f2,UNITY_DISPLAY_STYLE_INT);
  second_chunk = 0xb - first_chunk;
  cVar2 = cio_buffered_stream_read_at_least
                    (buffered_stream,&rb,second_chunk,dummy_read_handler,&second_chunk);
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x2f6,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x2f7,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_read_handler_fake.arg2_history[1],
             "Handler was not called with CIO_SUCCESS!",0x2f8,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&rb,(UNITY_INT)dummy_read_handler_fake.arg3_history[1],
             "Handler was not called with original read buffer!",0x2f9,UNITY_DISPLAY_STYLE_INT);
  iVar1 = bcmp(first_check_buffer,"HelloWorld!",0xb);
  if (iVar1 == 0) {
    cVar2 = cio_buffered_stream_close(buffered_stream);
    UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x2fe,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x2ff,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("Handler was not called with correct data!",0x2fb);
}

Assistant:

static void test_read_at_least_chunks(void)
{
	struct client *client = malloc(sizeof(*client));

	static const char *test_data = "HelloWorld!";
	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, test_data), "Could not allocate memory for test!");
	read_some_fake.custom_fake = read_some_chunks;
	dummy_read_handler_fake.custom_fake = save_to_check_buffer;

	uint8_t buffer[40];
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, &buffer, sizeof(buffer));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");

	size_t first_chunk = 2;
	err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_read_at_least(&client->bs, &rb, first_chunk, dummy_read_handler, &first_chunk);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_read_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_read_handler_fake.arg2_history[0], "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, dummy_read_handler_fake.arg3_history[0], "Handler was not called with original read buffer!");

	size_t second_chunk = strlen(test_data) - first_chunk;
	err = cio_buffered_stream_read_at_least(&client->bs, &rb, second_chunk, dummy_read_handler, &second_chunk);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(2, dummy_read_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_read_handler_fake.arg2_history[1], "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, dummy_read_handler_fake.arg3_history[1], "Handler was not called with original read buffer!");

	TEST_ASSERT_MESSAGE(memcmp((const char *)first_check_buffer, test_data, strlen(test_data)) == 0, "Handler was not called with correct data!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
}